

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O2

bool chain::str::equal<(chain::str::case_t)1>(string_view left,string_view right)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = left._M_len;
  if (sVar2 == right._M_len) {
    bVar1 = std::__equal4<char_const*,char_const*,bool(*)(unsigned_char,unsigned_char)>
                      (left._M_str,left._M_str + sVar2,right._M_str,right._M_str + sVar2,
                       equal_uchar<(chain::str::case_t)1>);
    return bVar1;
  }
  return false;
}

Assistant:

auto equal(std::string_view left, std::string_view right) -> bool
{
    if (left.length() == right.length())
    {
        if constexpr (case_type == case_t::sensitive)
        {
            return left == right;
        }
        else
        {
            return std::equal(left.begin(), left.end(), right.begin(), right.end(), equal_uchar<case_t::insensitive>);
        }
    }

    return false;
}